

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::operator+(Matrix44<float> *this,Matrix44<float> *v)

{
  float *in_RDX;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  
  Matrix44(in_RDI,*in_RSI + *in_RDX,in_RSI[1] + in_RDX[1],in_RSI[2] + in_RDX[2],
           in_RSI[3] + in_RDX[3],in_RSI[4] + in_RDX[4],in_RSI[5] + in_RDX[5],in_RSI[6] + in_RDX[6],
           in_RSI[7] + in_RDX[7],in_RSI[8] + in_RDX[8],in_RSI[9] + in_RDX[9],in_RSI[10] + in_RDX[10]
           ,in_RSI[0xb] + in_RDX[0xb],in_RSI[0xc] + in_RDX[0xc],in_RSI[0xd] + in_RDX[0xd],
           in_RSI[0xe] + in_RDX[0xe],in_RSI[0xf] + in_RDX[0xf]);
  return in_RDI;
}

Assistant:

Matrix44<T>
Matrix44<T>::operator + (const Matrix44<T> &v) const
{
    return Matrix44 (x[0][0] + v.x[0][0],
                     x[0][1] + v.x[0][1],
                     x[0][2] + v.x[0][2],
                     x[0][3] + v.x[0][3],
                     x[1][0] + v.x[1][0],
                     x[1][1] + v.x[1][1],
                     x[1][2] + v.x[1][2],
                     x[1][3] + v.x[1][3],
                     x[2][0] + v.x[2][0],
                     x[2][1] + v.x[2][1],
                     x[2][2] + v.x[2][2],
                     x[2][3] + v.x[2][3],
                     x[3][0] + v.x[3][0],
                     x[3][1] + v.x[3][1],
                     x[3][2] + v.x[3][2],
                     x[3][3] + v.x[3][3]);
}